

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexBoxFilter::buildKernel
          (PtexBoxFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,Res faceRes)

{
  int iVar1;
  undefined2 in_DX;
  Res *in_RSI;
  PtexBoxFilter *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float v2ceil;
  float v1floor;
  float u2ceil;
  float u1floor;
  float v2;
  float v1;
  float u2;
  float u1;
  Res res;
  uint8_t vreslog2;
  uint8_t ureslog2;
  Res local_2c;
  int8_t local_2a;
  int8_t local_29;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Res *local_18;
  undefined2 local_2;
  
  local_28 = in_XMM3_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_2 = in_DX;
  local_24 = PtexUtils::min<float>(in_XMM2_Da,1.0);
  local_28 = PtexUtils::min<float>(local_28,1.0);
  fVar3 = local_24;
  fVar2 = PtexUtils::reciprocalPow2((int)(char)local_2);
  local_24 = PtexUtils::max<float>(fVar3,fVar2);
  fVar3 = local_28;
  fVar2 = PtexUtils::reciprocalPow2((int)local_2._1_1_);
  local_28 = PtexUtils::max<float>(fVar3,fVar2);
  iVar1 = PtexUtils::calcResFromWidth(local_24);
  local_29 = (int8_t)iVar1;
  iVar1 = PtexUtils::calcResFromWidth(local_28);
  local_2a = (int8_t)iVar1;
  Res::Res(&local_2c,local_29,local_2a);
  *local_18 = local_2c;
  iVar1 = Res::u(local_18);
  local_1c = local_1c * (float)iVar1;
  iVar1 = Res::v(local_18);
  local_20 = local_20 * (float)iVar1;
  iVar1 = Res::u(local_18);
  local_24 = (float)iVar1 * local_24;
  iVar1 = Res::v(local_18);
  local_28 = (float)iVar1 * local_28;
  fVar3 = local_24 * -0.5 + local_1c;
  fVar2 = local_24 * 0.5 + local_1c;
  fVar4 = local_28 * -0.5 + local_20;
  fVar5 = local_28 * 0.5 + local_20;
  dVar6 = std::floor((double)(ulong)(uint)fVar3);
  dVar7 = std::ceil((double)(ulong)(uint)fVar2);
  dVar8 = std::floor((double)(ulong)(uint)fVar4);
  dVar9 = std::ceil((double)(ulong)(uint)fVar5);
  *(int *)(local_18 + 2) = (int)SUB84(dVar6,0);
  *(int *)(local_18 + 4) = (int)SUB84(dVar8,0);
  *(int *)(local_18 + 6) = (int)SUB84(dVar7,0) - *(int *)(local_18 + 2);
  *(int *)(local_18 + 8) = (int)SUB84(dVar9,0) - *(int *)(local_18 + 4);
  computeWeights(in_RDI,*(float **)(local_18 + 0xc),*(int *)(local_18 + 6),
                 1.0 - (fVar3 - SUB84(dVar6,0)),1.0 - (SUB84(dVar7,0) - fVar2));
  computeWeights(in_RDI,*(float **)(local_18 + 0x10),*(int *)(local_18 + 8),
                 1.0 - (fVar4 - SUB84(dVar8,0)),1.0 - (SUB84(dVar9,0) - fVar5));
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        // compute desired texture res based on filter width
        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        u = u * (float)k.res.u();
        v = v * (float)k.res.v();
        uw *= (float)k.res.u();
        vw *= (float)k.res.v();

        // find integer pixel extent: [u,v] +/- [uw/2,vw/2]
        // (box is 1 unit wide for a 1 unit filter period)
        float u1 = u - 0.5f*uw, u2 = u + 0.5f*uw;
        float v1 = v - 0.5f*vw, v2 = v + 0.5f*vw;
        float u1floor = PtexUtils::floor(u1), u2ceil = PtexUtils::ceil(u2);
        float v1floor = PtexUtils::floor(v1), v2ceil = PtexUtils::ceil(v2);
        k.u = int(u1floor);
        k.v = int(v1floor);
        k.uw = int(u2ceil)-k.u;
        k.vw = int(v2ceil)-k.v;

        // compute kernel weights along u and v directions
        computeWeights(k.ku, k.uw, 1.0f-(u1-u1floor), 1.0f-(u2ceil-u2));
        computeWeights(k.kv, k.vw, 1.0f-(v1-v1floor), 1.0f-(v2ceil-v2));
    }